

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_filter.cpp
# Opt level: O2

void __thiscall
duckdb::StatisticsPropagator::SetStatisticsNotNull(StatisticsPropagator *this,ColumnBinding binding)

{
  iterator iVar1;
  pointer this_00;
  ColumnBinding binding_local;
  
  binding_local.column_index = binding.column_index;
  binding_local.table_index = binding.table_index;
  iVar1 = ::std::
          _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->statistics_map)._M_h,&binding_local);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)((long)iVar1.
                                     super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                     ._M_cur + 0x18));
    BaseStatistics::Set(this_00,CANNOT_HAVE_NULL_VALUES);
  }
  return;
}

Assistant:

void StatisticsPropagator::SetStatisticsNotNull(ColumnBinding binding) {
	auto entry = statistics_map.find(binding);
	if (entry == statistics_map.end()) {
		return;
	}
	entry->second->Set(StatsInfo::CANNOT_HAVE_NULL_VALUES);
}